

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

long __thiscall FString::LastIndexOf(FString *this,char *substr,long endIndex)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  ulong uVar4;
  
  __n = strlen(substr);
  pcVar1 = this->Chars;
  uVar4 = (ulong)*(uint *)(pcVar1 + -0xc);
  if (uVar4 < (ulong)endIndex) {
    endIndex = uVar4;
  }
  do {
    if (endIndex <= (long)(__n - 1)) {
      return -1;
    }
    lVar2 = endIndex - __n;
    endIndex = endIndex - 1;
    iVar3 = strncmp(substr,pcVar1 + lVar2,__n);
  } while (iVar3 != 0);
  return endIndex;
}

Assistant:

long FString::LastIndexOf (const char *substr, long endIndex) const
{
	return LastIndexOf (substr, endIndex, strlen(substr));
}